

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

TestResults __thiscall
ExternalTester::getError
          (ExternalTester *this,BaseFunction *f,TasmanianSparseGrid *grid,TestType type,
          vector<double,_std::allocator<double>_> *x)

{
  allocator<double> *paVar1;
  double dVar2;
  double dVar3;
  int num_dimensions_00;
  int iVar4;
  reference pvVar5;
  double *pdVar6;
  double *pdVar7;
  reference pvVar8;
  vector<double,_std::allocator<double>_> *this_00;
  double extraout_XMM0_Qa;
  TestResults TVar9;
  double local_320;
  int local_29c;
  int local_1fc;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  value_type local_1d8;
  int local_1cc;
  double dStack_1c8;
  int i_4;
  double err_1;
  double nrm;
  ExternalTester *pEStack_1b0;
  int k_2;
  double rel_err;
  int local_1a0;
  int i_3;
  int i_2;
  vector<double,_std::allocator<double>_> result_true;
  undefined1 local_178 [8];
  vector<double,_std::allocator<double>_> result_tasm;
  undefined1 local_158 [4];
  int num_entries_1;
  vector<double,_std::allocator<double>_> test_x;
  ExternalTester *pEStack_138;
  int j_1;
  double err;
  int k_1;
  int i_1;
  int j;
  int k;
  int i;
  undefined1 local_110 [8];
  vector<double,_std::allocator<double>_> r;
  undefined1 local_f0 [8];
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_98;
  undefined1 local_80 [8];
  vector<double,_std::allocator<double>_> weights;
  vector<double,_std::allocator<double>_> points;
  int num_entries;
  int num_points;
  int num_outputs;
  int num_dimensions;
  vector<double,_std::allocator<double>_> *x_local;
  TestType type_local;
  TasmanianSparseGrid *grid_local;
  BaseFunction *f_local;
  ExternalTester *this_local;
  TestResults R;
  
  num_dimensions_00 = (**f->_vptr_BaseFunction)();
  local_29c = (*f->_vptr_BaseFunction[1])();
  iVar4 = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  if (((type == type_integration) || (type == type_nodal_interpolation)) ||
     (type == type_nodal_differentiation)) {
    local_1fc = local_29c;
    if (type == type_nodal_differentiation) {
      local_1fc = num_dimensions_00 * local_29c;
    }
    TasGrid::TasmanianSparseGrid::getPoints
              ((vector<double,_std::allocator<double>_> *)
               &weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,grid);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_80);
    if (type == type_integration) {
      TasGrid::TasmanianSparseGrid::getQuadratureWeights(&local_98,grid);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_80,&local_98);
      std::vector<double,_std::allocator<double>_>::~vector(&local_98);
    }
    else if (type == type_nodal_interpolation) {
      TasGrid::TasmanianSparseGrid::getInterpolationWeights((vector *)&local_c0);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_80,&local_c0);
      std::vector<double,_std::allocator<double>_>::~vector(&local_c0);
    }
    else {
      TasGrid::TasmanianSparseGrid::getDifferentiationWeights
                ((vector *)
                 &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_80,
                 (vector<double,_std::allocator<double>_> *)
                 &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    paVar1 = (allocator<double> *)
             ((long)&r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_f0,(long)local_1fc,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    _i = 0.0;
    std::allocator<double>::allocator((allocator<double> *)((long)&k + 3));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_110,(long)local_1fc,
               (value_type_conflict1 *)&i,(allocator<double> *)((long)&k + 3));
    std::allocator<double>::~allocator((allocator<double> *)((long)&k + 3));
    if (type == type_nodal_differentiation) {
      for (j = 0; j < iVar4; j = j + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(j * num_dimensions_00)
                           );
        pdVar6 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)local_f0);
        (*f->_vptr_BaseFunction[3])(f,pvVar5,pdVar6);
        for (i_1 = 0; i_1 < local_29c; i_1 = i_1 + 1) {
          for (k_1 = 0; k_1 < num_dimensions_00; k_1 = k_1 + 1) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_80,
                                (long)(j * num_dimensions_00 + k_1));
            dVar2 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_f0,(long)i_1);
            dVar3 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_110,
                                (long)(i_1 * num_dimensions_00 + k_1));
            *pvVar5 = dVar2 * dVar3 + *pvVar5;
          }
        }
      }
    }
    else {
      for (err._4_4_ = 0; err._4_4_ < iVar4; err._4_4_ = err._4_4_ + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                            (long)(err._4_4_ * num_dimensions_00));
        pdVar6 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)local_f0);
        (*f->_vptr_BaseFunction[3])(f,pvVar5,pdVar6);
        for (err._0_4_ = 0; err._0_4_ < local_1fc; err._0_4_ = err._0_4_ + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_80,(long)err._4_4_);
          dVar2 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_f0,(long)err._0_4_);
          dVar3 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_110,(long)err._0_4_);
          *pvVar5 = dVar2 * dVar3 + *pvVar5;
        }
      }
    }
    pEStack_138 = (ExternalTester *)0x0;
    if (type == type_integration) {
      pdVar6 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)local_f0);
      (*f->_vptr_BaseFunction[4])(f,pdVar6);
    }
    else if (type == type_nodal_differentiation) {
      pdVar6 = std::vector<double,_std::allocator<double>_>::data(x);
      pdVar7 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)local_f0);
      (*f->_vptr_BaseFunction[5])(f,pdVar6,pdVar7);
    }
    else {
      pdVar6 = std::vector<double,_std::allocator<double>_>::data(x);
      pdVar7 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)local_f0);
      (*f->_vptr_BaseFunction[3])(f,pdVar6,pdVar7);
    }
    for (test_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        test_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < local_1fc;
        test_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             test_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)local_f0,
                 (long)test_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_);
      this_00 = (vector<double,_std::allocator<double>_> *)local_110;
      std::vector<double,_std::allocator<double>_>::operator[]
                (this_00,(long)test_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
      std::abs((int)this_00);
      pEStack_138 = (ExternalTester *)(extraout_XMM0_Qa + (double)pEStack_138);
    }
    this_local = pEStack_138;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_110);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_f0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_80);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else if ((type == type_internal_interpolation) || (type == type_internal_differentiation)) {
    loadValues(f,grid);
    genRandom((vector<double,_std::allocator<double>_> *)local_158,this->num_mc,num_dimensions_00);
    if (type != type_internal_interpolation) {
      local_29c = local_29c * num_dimensions_00;
    }
    result_tasm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = local_29c;
    iVar4 = this->num_mc;
    paVar1 = (allocator<double> *)
             ((long)&result_true.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_178,(long)(iVar4 * local_29c),paVar1
              );
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&result_true.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    iVar4 = this->num_mc *
            result_tasm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<double>::allocator((allocator<double> *)((long)&i_3 + 3));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&i_2,(long)iVar4,
               (allocator<double> *)((long)&i_3 + 3));
    std::allocator<double>::~allocator((allocator<double> *)((long)&i_3 + 3));
    if (type == type_internal_interpolation) {
      for (local_1a0 = 0; local_1a0 < this->num_mc; local_1a0 = local_1a0 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_158,
                            (long)(local_1a0 * num_dimensions_00));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)local_178,
                   (long)(local_1a0 *
                         result_tasm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_));
        TasGrid::TasmanianSparseGrid::evaluate((double *)grid,pvVar5);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_158,
                            (long)(local_1a0 * num_dimensions_00));
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i_2,
                            (long)(local_1a0 *
                                  result_tasm.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
        (*f->_vptr_BaseFunction[3])(f,pvVar5,pvVar8);
      }
    }
    else {
      for (rel_err._4_4_ = 0; rel_err._4_4_ < this->num_mc; rel_err._4_4_ = rel_err._4_4_ + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_158,
                            (long)(rel_err._4_4_ * num_dimensions_00));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)local_178,
                   (long)(rel_err._4_4_ *
                         result_tasm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_));
        TasGrid::TasmanianSparseGrid::differentiate((double *)grid,pvVar5);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_158,
                            (long)(rel_err._4_4_ * num_dimensions_00));
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i_2,
                            (long)(rel_err._4_4_ *
                                  result_tasm.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
        (*f->_vptr_BaseFunction[5])(f,pvVar5,pvVar8);
      }
    }
    pEStack_1b0 = (ExternalTester *)0x0;
    for (nrm._4_4_ = 0;
        nrm._4_4_ <
        result_tasm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; nrm._4_4_ = nrm._4_4_ + 1) {
      err_1 = 0.0;
      dStack_1c8 = 0.0;
      for (local_1cc = 0; local_1cc < this->num_mc; local_1cc = local_1cc + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i_2,
                            (long)(local_1cc *
                                   result_tasm.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                  nrm._4_4_));
        local_1d8 = ABS(*pvVar5);
        pdVar6 = std::max<double>(&err_1,&local_1d8);
        err_1 = *pdVar6;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i_2,
                            (long)(local_1cc *
                                   result_tasm.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                  nrm._4_4_));
        dVar2 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_178,
                            (long)(local_1cc *
                                   result_tasm.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                  nrm._4_4_));
        local_1e0 = ABS(dVar2 - *pvVar5);
        pdVar6 = std::max<double>(&stack0xfffffffffffffe38,&local_1e0);
        dStack_1c8 = *pdVar6;
      }
      if (1e-12 < ABS(err_1)) {
        local_320 = dStack_1c8 / err_1;
      }
      else {
        local_320 = dStack_1c8;
      }
      local_1e8 = local_320;
      pdVar6 = std::max<double>((double *)&stack0xfffffffffffffe50,&local_1e8);
      pEStack_1b0 = (ExternalTester *)*pdVar6;
    }
    if (type == type_internal_differentiation) {
      local_1f0 = unitDerivativeTests(f,grid);
      pdVar6 = std::max<double>((double *)&stack0xfffffffffffffe50,&local_1f0);
      pEStack_1b0 = (ExternalTester *)*pdVar6;
    }
    this_local = pEStack_1b0;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&i_2);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_178);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_158);
  }
  TVar9.num_points = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  TVar9.error = (double)this_local;
  TVar9._12_4_ = 0;
  return TVar9;
}

Assistant:

TestResults ExternalTester::getError(const BaseFunction *f, TasGrid::TasmanianSparseGrid &grid, TestType type, std::vector<double> const &x) const{
    TestResults R;
    int num_dimensions = f->getNumInputs();
    int num_outputs = f->getNumOutputs();
    int num_points = grid.getNumPoints();
    if (type == type_integration or type == type_nodal_interpolation or type == type_nodal_differentiation){
        int num_entries = (type == type_nodal_differentiation) ? num_dimensions * num_outputs : num_outputs;
        auto points = grid.getPoints();
        std::vector<double> weights;
        if (type == type_integration)
            weights = grid.getQuadratureWeights();
        else if (type == type_nodal_interpolation)
            weights = grid.getInterpolationWeights(x);
        else
            weights = grid.getDifferentiationWeights(x);

        // Sequential version
        std::vector<double> y(num_entries);
        std::vector<double> r(num_entries, 0.0);
        if (type == type_nodal_differentiation){
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for (int k=0; k<num_outputs; k++)
                    for(int j=0; j<num_dimensions; j++)
                        r[k * num_dimensions + j] += weights[i * num_dimensions + j] * y[k];
            }
        }else{
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for(int k=0; k<num_entries; k++)
                    r[k] += weights[i] * y[k];
            }
        }

        double err = 0.0;
        if (type == type_integration){
            f->getIntegral(y.data());
        }else if (type == type_nodal_differentiation){
            f->getDerivative(x.data(), y.data());
        }else{
            f->eval(x.data(), y.data());
        }
        for(int j=0; j<num_entries; j++){
            err += std::abs(y[j] - r[j]);
        };
        R.error = err;
    }else if (type == type_internal_interpolation or type == type_internal_differentiation){
        // load needed points
        loadValues(f, grid);

        std::vector<double> test_x = genRandom(num_mc, num_dimensions);
        int num_entries = (type == type_internal_interpolation) ? num_outputs : num_outputs * num_dimensions;
        std::vector<double> result_tasm(num_mc * num_entries);
        std::vector<double> result_true(num_mc * num_entries);
        if (type == type_internal_interpolation) {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.evaluate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->eval(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        } else {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.differentiate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->getDerivative(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        }

        double rel_err = 0.0; // relative error
        for(int k=0; k<num_entries; k++){
            double nrm = 0.0; // norm, needed to compute relative error
            double err = 0.0; // absolute error
            for(int i=0; i<num_mc; i++){
                nrm = std::max(nrm, std::fabs(result_true[i * num_entries + k]));
                err = std::max(err, std::fabs(result_true[i * num_entries + k] - result_tasm[i * num_entries + k]));
            }
            rel_err = std::max(rel_err, std::fabs(nrm) <= Maths::num_tol ? err : err / nrm);
        }

        if (type == type_internal_differentiation)
            rel_err = std::max(rel_err, unitDerivativeTests(f, grid));

        R.error = rel_err;
    }
    R.num_points = grid.getNumPoints();
    return R;
}